

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall FIX::Message::validate(Message *this)

{
  int iVar1;
  int iVar2;
  FieldBase *pFVar3;
  ostream *poVar4;
  InvalidMessage *pIVar5;
  string local_208 [3];
  stringstream text;
  ostream local_198 [376];
  
  pFVar3 = FieldMap::getFieldRef(&(this->m_header).super_FieldMap,9);
  iVar1 = IntField::getValue((IntField *)pFVar3);
  iVar2 = bodyLength(this,8,9,10);
  if (iVar1 != iVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&text);
    poVar4 = std::operator<<(local_198,"Expected BodyLength=");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,", Received BodyLength=");
    std::ostream::operator<<((ostream *)poVar4,iVar1);
    pIVar5 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::stringbuf::str();
    InvalidMessage::InvalidMessage(pIVar5,local_208);
    __cxa_throw(pIVar5,&InvalidMessage::typeinfo,Exception::~Exception);
  }
  pFVar3 = FieldMap::getFieldRef(&(this->m_trailer).super_FieldMap,10);
  iVar1 = CheckSumField::getValue((CheckSumField *)pFVar3);
  iVar2 = checkSum(this,10);
  if (iVar1 == iVar2) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&text);
  poVar4 = std::operator<<(local_198,"Expected CheckSum=");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,", Received CheckSum=");
  std::ostream::operator<<((ostream *)poVar4,iVar1);
  pIVar5 = (InvalidMessage *)__cxa_allocate_exception(0x50);
  std::__cxx11::stringbuf::str();
  InvalidMessage::InvalidMessage(pIVar5,local_208);
  __cxa_throw(pIVar5,&InvalidMessage::typeinfo,Exception::~Exception);
}

Assistant:

void Message::validate() const
{
  try
  {
    const BodyLength& aBodyLength = FIELD_GET_REF( m_header, BodyLength );

    const int expectedLength = (int)aBodyLength;
    const int actualLength = bodyLength();

    if ( expectedLength != actualLength )
    {
      std::stringstream text;
      text << "Expected BodyLength=" << actualLength
           << ", Received BodyLength=" << expectedLength;
      throw InvalidMessage(text.str());
    }

    const CheckSum& aCheckSum = FIELD_GET_REF( m_trailer, CheckSum );

    const int expectedChecksum = (int)aCheckSum;
    const int actualChecksum = checkSum();

    if ( expectedChecksum != actualChecksum )
    {
      std::stringstream text;
      text << "Expected CheckSum=" << actualChecksum
           << ", Received CheckSum=" << expectedChecksum;
      throw InvalidMessage(text.str());
    }
  }
  catch ( FieldNotFound& e )
  {
    const std::string fieldName = ( e.field == FIX::FIELD::BodyLength ) ? "BodyLength" : "CheckSum";
    throw InvalidMessage( fieldName + std::string(" is missing") );
  }
  catch ( IncorrectDataFormat& e )
  {
    const std::string fieldName = ( e.field == FIX::FIELD::BodyLength ) ? "BodyLength" : "CheckSum";
    throw InvalidMessage( fieldName + std::string(" has wrong format: ") + e.detail );
  }
}